

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Number * __thiscall LiteScript::Number::operator-=(Number *this,Number *number)

{
  float fVar1;
  float fVar2;
  Number local_20;
  Number *local_18;
  Number *number_local;
  Number *this_local;
  
  if ((this->numeric_type == '\0') && (number->numeric_type == '\0')) {
    (this->value).integer = (this->value).integer - (number->value).integer;
  }
  else {
    local_18 = number;
    number_local = this;
    fVar1 = operator_cast_to_float(this);
    fVar2 = operator_cast_to_float(local_18);
    Number(&local_20,fVar1 - fVar2);
    operator=(this,&local_20);
  }
  return this;
}

Assistant:

LiteScript::Number& LiteScript::Number::operator-=(const LiteScript::Number& number) {
    if (this->numeric_type == 0 && number.numeric_type == 0)
        this->value.integer -= number.value.integer;
    else
        *this = (float)*this - (float)number;
    return *this;
}